

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# luckyFast6.c
# Opt level: O1

word Extra_Truth6MinimumRoundMany(word t,int *pStore,char *pCanonPerm,uint *pCanonPhase)

{
  int iVar1;
  word t_00;
  int iVar2;
  long lVar3;
  bool bVar4;
  
  do {
    iVar2 = *pStore;
    lVar3 = 0;
    t_00 = t;
    do {
      iVar1 = pStore[lVar3 + 1];
      if (iVar2 == pStore[lVar3 + 1]) {
        t_00 = Extra_Truth6MinimumRoundOne(t_00,(int)lVar3,pCanonPerm,pCanonPhase);
        iVar1 = iVar2;
      }
      iVar2 = iVar1;
      lVar3 = lVar3 + 1;
    } while (lVar3 != 5);
    bVar4 = t != t_00;
    t = t_00;
  } while (bVar4);
  return t_00;
}

Assistant:

word Extra_Truth6MinimumRoundMany( word t, int* pStore, char* pCanonPerm, unsigned* pCanonPhase )
{
    int i, bitInfoTemp;
    word tMin0, tMin=t;
    do
    {
        bitInfoTemp = pStore[0];
        tMin0 = tMin;
        for ( i = 0; i < 5; i++ )
        {
            if(bitInfoTemp == pStore[i+1])          
                tMin = Extra_Truth6MinimumRoundOne( tMin, i, pCanonPerm, pCanonPhase );         
            else
                bitInfoTemp = pStore[i+1];
        }
    }while ( tMin0 != tMin );
    return tMin;
}